

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throw_exception.hpp
# Opt level: O1

void boost::throw_exception<std::runtime_error>(runtime_error *e)

{
  wrapexcept<std::runtime_error> *__return_storage_ptr__;
  
  __return_storage_ptr__ = (wrapexcept<std::runtime_error> *)__cxa_allocate_exception(0x40);
  exception_detail::enable_both<std::runtime_error>(__return_storage_ptr__,e);
  __cxa_throw(__return_storage_ptr__,&wrapexcept<std::runtime_error>::typeinfo,
              wrapexcept<std::runtime_error>::~wrapexcept);
}

Assistant:

BOOST_NORETURN inline void throw_exception( E const & e )
{
    //All boost exceptions are required to derive from std::exception,
    //to ensure compatibility with BOOST_NO_EXCEPTIONS.
    throw_exception_assert_compatibility(e);

#ifndef BOOST_EXCEPTION_DISABLE
    throw exception_detail::enable_both( e );
#else
    throw e;
#endif
}